

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test1(void)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  vector<int> local_68;
  vector<int> local_50;
  vector<int> v2;
  vector<int> w2;
  
  local_50.mData = (int *)operator_new__(0x28);
  local_50.mData[0] = 0;
  local_50.mData[1] = 0;
  local_50.mData[2] = 0;
  local_50.mData[3] = 0;
  local_50.mData[4] = 0;
  local_50.mData[5] = 0;
  local_50.mData[6] = 0;
  local_50.mData[7] = 0;
  local_50.mData[8] = 0;
  local_50.mData[9] = 0;
  local_50.mCap = 10;
  local_50.mSize = 10;
  local_68.mData = (int *)operator_new__(0xc);
  local_68.mData[2] = 0;
  local_68.mData[0] = 0;
  local_68.mData[1] = 0;
  local_68.mCap = 3;
  local_68.mSize = 3;
  CP::vector<int>::vector(&v2,&local_50);
  CP::vector<int>::vector(&w2,&local_68);
  sVar3 = local_50.mSize;
  sVar2 = local_50.mCap;
  piVar1 = local_50.mData;
  local_50.mData = local_68.mData;
  local_68.mData = piVar1;
  local_50.mCap = local_68.mCap;
  local_50.mSize = local_68.mSize;
  local_68.mCap = sVar2;
  local_68.mSize = sVar3;
  bVar4 = CP::vector<int>::operator==(&local_50,&w2);
  if (bVar4) {
    bVar4 = CP::vector<int>::operator==(&local_68,&v2);
    bVar5 = true;
    if (bVar4) goto LAB_0010129f;
  }
  bVar5 = false;
LAB_0010129f:
  CP::vector<int>::~vector(&w2);
  CP::vector<int>::~vector(&v2);
  CP::vector<int>::~vector(&local_68);
  CP::vector<int>::~vector(&local_50);
  return bVar5;
}

Assistant:

bool test1() {
  CP::vector<int> v(10);
  CP::vector<int> w(3);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}